

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::
GeometryShaderMaxOutputComponentsSinglePointTest
          (GeometryShaderMaxOutputComponentsSinglePointTest *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  GeometryShaderLimitsRenderingBase::GeometryShaderLimitsRenderingBase
            (&this->super_GeometryShaderLimitsRenderingBase,context,extParams,name,description);
  (this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderMaxOutputComponentsSinglePointTest_01df83b0;
  (this->m_fragment_shader_code)._M_dataplus._M_p = (pointer)&(this->m_fragment_shader_code).field_2
  ;
  (this->m_fragment_shader_code)._M_string_length = 0;
  (this->m_fragment_shader_code).field_2._M_local_buf[0] = '\0';
  (this->m_geometry_shader_code)._M_dataplus._M_p = (pointer)&(this->m_geometry_shader_code).field_2
  ;
  (this->m_geometry_shader_code)._M_string_length = 0;
  (this->m_geometry_shader_code).field_2._M_local_buf[0] = '\0';
  this->m_max_output_components = 0;
  this->m_max_output_vectors = 0;
  this->m_n_available_vectors = 0;
  return;
}

Assistant:

GeometryShaderMaxOutputComponentsSinglePointTest::GeometryShaderMaxOutputComponentsSinglePointTest(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: GeometryShaderLimitsRenderingBase(context, extParams, name, description)
	, m_max_output_components(0)
	, m_max_output_vectors(0)
	, m_n_available_vectors(0)
{
	/* Nothing to be done here */
}